

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_gather(REF_HISTOGRAM ref_histogram,REF_MPI ref_mpi)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT observations;
  REF_INT i;
  REF_DBL log_total;
  REF_DBL max;
  REF_DBL min;
  REF_INT *bins;
  REF_MPI ref_mpi_local;
  REF_HISTOGRAM ref_histogram_local;
  
  bins = &ref_mpi->n;
  ref_mpi_local = (REF_MPI)ref_histogram;
  if (ref_histogram->nbin < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x79,"ref_histogram_gather","malloc bins of REF_INT negative");
    ref_histogram_local._4_4_ = 1;
  }
  else {
    min = (REF_DBL)malloc((long)ref_histogram->nbin << 2);
    if ((void *)min == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x79,"ref_histogram_gather","malloc bins of REF_INT NULL");
      ref_histogram_local._4_4_ = 2;
    }
    else {
      uVar1 = ref_mpi_sum((REF_MPI)bins,*(void **)&ref_mpi_local->timing,(void *)min,
                          ref_mpi_local->native_alltoallv,1);
      if (uVar1 == 0) {
        uVar1 = ref_mpi_max((REF_MPI)bins,ref_mpi_local,&log_total,3);
        if (uVar1 == 0) {
          uVar1 = ref_mpi_min((REF_MPI)bins,&ref_mpi_local->max_tag,&max,3);
          if (uVar1 == 0) {
            uVar1 = ref_mpi_sum((REF_MPI)bins,&ref_mpi_local->comm,&observations,1,3);
            if (uVar1 == 0) {
              if (bins[1] == 0) {
                *(REF_DBL *)ref_mpi_local = log_total;
                *(REF_DBL *)&ref_mpi_local->max_tag = max;
                ref_mpi_local->comm = _observations;
                for (ref_private_macro_code_rss = 0;
                    ref_private_macro_code_rss < ref_mpi_local->native_alltoallv;
                    ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                  *(undefined4 *)
                   (*(long *)&ref_mpi_local->timing + (long)ref_private_macro_code_rss * 4) =
                       *(undefined4 *)((long)min + (long)ref_private_macro_code_rss * 4);
                }
                ref_private_macro_code_rss_1 = 0;
                for (ref_private_macro_code_rss = 0;
                    ref_private_macro_code_rss < ref_mpi_local->native_alltoallv;
                    ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                  ref_private_macro_code_rss_1 =
                       *(int *)(*(long *)&ref_mpi_local->timing +
                               (long)ref_private_macro_code_rss * 4) + ref_private_macro_code_rss_1;
                }
                ref_mpi_local->start_time = 0.0;
                if (0 < ref_private_macro_code_rss_1) {
                  ref_mpi_local->start_time =
                       (double)_observations / (double)ref_private_macro_code_rss_1;
                }
              }
              else {
                ref_mpi_local->n = 0x78b58c40;
                ref_mpi_local->id = -0x3bea50e3;
                *(undefined8 *)&ref_mpi_local->max_tag = 0x4415af1d78b58c40;
                ref_mpi_local->comm = (void *)0x0;
                for (ref_private_macro_code_rss = 0;
                    ref_private_macro_code_rss < ref_mpi_local->native_alltoallv;
                    ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                  *(undefined4 *)
                   (*(long *)&ref_mpi_local->timing + (long)ref_private_macro_code_rss * 4) = 0;
                }
                ref_mpi_local->start_time = 0.0;
              }
              uVar1 = ref_mpi_bcast((REF_MPI)bins,&ref_mpi_local->start_time,1,3);
              if (uVar1 == 0) {
                if (min != 0.0) {
                  free((void *)min);
                }
                ref_histogram_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                       ,0x9f,"ref_histogram_gather",(ulong)uVar1,"log_mean");
                ref_histogram_local._4_4_ = uVar1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                     ,0x86,"ref_histogram_gather",(ulong)uVar1,"log_total");
              ref_histogram_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                   ,0x83,"ref_histogram_gather",(ulong)uVar1,"min");
            ref_histogram_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x80,"ref_histogram_gather",(ulong)uVar1,"max");
          ref_histogram_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
               ,0x7d,"ref_histogram_gather",(ulong)uVar1,"sum");
        ref_histogram_local._4_4_ = uVar1;
      }
    }
  }
  return ref_histogram_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_gather(REF_HISTOGRAM ref_histogram,
                                        REF_MPI ref_mpi) {
  REF_INT *bins;
  REF_DBL min, max, log_total;
  REF_INT i, observations;

  ref_malloc(bins, ref_histogram_nbin(ref_histogram), REF_INT);

  RSS(ref_mpi_sum(ref_mpi, ref_histogram->bins, bins,
                  ref_histogram_nbin(ref_histogram), REF_INT_TYPE),
      "sum");
  RSS(ref_mpi_max(ref_mpi, &ref_histogram_max(ref_histogram), &max,
                  REF_DBL_TYPE),
      "max");
  RSS(ref_mpi_min(ref_mpi, &ref_histogram_min(ref_histogram), &min,
                  REF_DBL_TYPE),
      "min");
  RSS(ref_mpi_sum(ref_mpi, &ref_histogram_log_total(ref_histogram), &log_total,
                  1, REF_DBL_TYPE),
      "log_total");

  if (ref_mpi_once(ref_mpi)) {
    ref_histogram_max(ref_histogram) = max;
    ref_histogram_min(ref_histogram) = min;
    ref_histogram_log_total(ref_histogram) = log_total;
    for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
      ref_histogram->bins[i] = bins[i];
    observations = 0;
    for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
      observations += ref_histogram->bins[i];
    ref_histogram_log_mean(ref_histogram) = 0.0;
    if (observations > 0)
      ref_histogram_log_mean(ref_histogram) = log_total / (REF_DBL)observations;
  } else {
    ref_histogram_max(ref_histogram) = -1.0e20;
    ref_histogram_min(ref_histogram) = 1.0e20;
    ref_histogram_log_total(ref_histogram) = 0.0;
    for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
      ref_histogram->bins[i] = 0;
    ref_histogram_log_mean(ref_histogram) = 0.0;
  }

  RSS(ref_mpi_bcast(ref_mpi, &ref_histogram_log_mean(ref_histogram), 1,
                    REF_DBL_TYPE),
      "log_mean");

  ref_free(bins);

  return REF_SUCCESS;
}